

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall
TPZMatrix<TPZFlopCounter>::AddKel
          (TPZMatrix<TPZFlopCounter> *this,TPZFMatrix<TPZFlopCounter> *elmat,
          TPZVec<long> *destinationindex)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  TPZFlopCounter prevval;
  double local_48;
  TPZVec<long> *local_40;
  long local_38;
  
  lVar5 = (elmat->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.fRow;
  local_40 = destinationindex;
  iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x10])();
  local_38 = lVar5;
  if (iVar3 == 0) {
    if (0 < lVar5) {
      lVar5 = 0;
      do {
        lVar1 = local_40->fStore[lVar5];
        lVar4 = 0;
        do {
          lVar2 = local_40->fStore[lVar4];
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar1,lVar2);
          if (((elmat->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.fRow <= lVar5) ||
             ((elmat->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.fCol <= lVar4)) {
            TPZFMatrix<TPZFlopCounter>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_48 = elmat->fElem
                     [(elmat->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.fRow * lVar4 +
                      lVar5].fVal + extraout_XMM0_Qa_00;
          TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,lVar1,lVar2,&local_48);
          lVar4 = lVar4 + 1;
        } while (local_38 != lVar4);
        lVar5 = lVar5 + 1;
      } while (lVar5 != local_38);
    }
  }
  else if (0 < lVar5) {
    lVar5 = 0;
    do {
      lVar1 = local_40->fStore[lVar5];
      lVar4 = lVar5;
      do {
        lVar2 = local_40->fStore[lVar4];
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar1,lVar2);
        if (((elmat->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.fRow <= lVar5) ||
           ((elmat->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.fCol <= lVar4)) {
          TPZFMatrix<TPZFlopCounter>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_48 = elmat->fElem
                   [(elmat->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.fRow * lVar4 +
                    lVar5].fVal + extraout_XMM0_Qa;
        TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar1,lVar2,&local_48);
        lVar4 = lVar4 + 1;
      } while (lVar4 < local_38);
      lVar5 = lVar5 + 1;
    } while (lVar5 != local_38);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &destinationindex) {
	
	int64_t nelem = elmat.Rows();
  	int64_t icoef,jcoef,ieq,jeq;
	if(IsSymmetric()) {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			for(jcoef=icoef; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				TVar prevval = GetVal(ieq,jeq);
				prevval += elmat(icoef,jcoef);
				PutVal(ieq,jeq,prevval);
			}
		}
	} else {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			for(jcoef=0; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				TVar prevval = GetVal(ieq,jeq);
				prevval += elmat(icoef,jcoef);
				PutVal(ieq,jeq,prevval);
			}
		}
	}
}